

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void ConnectSolution(int64_t cindex,TPZCompMesh *cmesh,TPZFMatrix<double> *glob,TPZVec<double> *sol)

{
  long row;
  int iVar1;
  TNode *pTVar2;
  TPZConnect *pTVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(cmesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,cindex);
  iVar1 = (int)pTVar3->fSequenceNumber;
  pTVar2 = (cmesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
  lVar7 = (long)pTVar2[iVar1].dim;
  lVar5 = (long)pTVar2[iVar1].pos;
  (*sol->_vptr_TPZVec[4])(sol,lVar7);
  for (lVar6 = 0; row = lVar5 + lVar6, row < lVar7 + lVar5; lVar6 = lVar6 + 1) {
    pdVar4 = TPZFMatrix<double>::operator()(glob,row,0);
    sol->fStore[lVar6] = *pdVar4;
  }
  return;
}

Assistant:

static void ConnectSolution(int64_t cindex, TPZCompMesh *cmesh, TPZFMatrix<STATE> &glob, TPZVec<STATE> &sol)
{
    int64_t seqnum = cmesh->ConnectVec()[cindex].SequenceNumber();
    int blsize = cmesh->Block().Size(seqnum);
    int position = cmesh->Block().Position(seqnum);
    sol.resize(blsize);
    for (int64_t i=position; i< position+blsize; i++) {
        sol[i-position] = glob(i,0);
    }
}